

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O2

int ON_String::MapString
              (ON_Locale *locale,ON_StringMapType map_type,char *string,int element_count,
              char *mapped_string,int mapped_string_capacity)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  wchar_t *sWideChar;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  ON_StringMapOrdinalType OStackY_70;
  ON_wString wide_mapped_string;
  ON_wString wide_string;
  
  if (mapped_string_capacity < 0) {
    pcVar6 = "mapped_string_capacity is < 0.";
    iVar5 = 0xa4b;
  }
  else {
    uVar7 = (ulong)(uint)element_count;
    if (mapped_string_capacity == 0) {
      mapped_string = (char *)0x0;
    }
    else {
      if (mapped_string == (char *)0x0) {
        pcVar6 = "mapped_string is nullptr.";
        iVar5 = 0xa55;
        goto LAB_005c514d;
      }
      if (string != mapped_string) {
        *mapped_string = '\0';
      }
    }
    if (element_count < 0) {
      uVar3 = Length(string);
      uVar7 = (ulong)uVar3;
      if ((int)uVar3 < 0) {
        return 0;
      }
    }
    iVar5 = (int)uVar7;
    if (iVar5 == 0) {
      return 1;
    }
    if (string != (char *)0x0) {
      bVar2 = ON_Locale::IsOrdinal(locale);
      if (bVar2) {
        if (mapped_string_capacity == 0) {
          return iVar5;
        }
      }
      else {
        pcVar8 = string + uVar7;
        pcVar6 = string;
        while (pcVar6 < pcVar8) {
          cVar1 = *pcVar6;
          pcVar6 = pcVar6 + 1;
          if (cVar1 < '\0') {
            ON_wString::ON_wString(&wide_string,string,iVar5);
            ON_wString::MapString
                      (&wide_mapped_string,(ON_Locale *)&wide_string,(ON_StringMapType)locale);
            sWideChar = ON_wString::operator_cast_to_wchar_t_(&wide_mapped_string);
            iVar5 = ON_wString::Length(&wide_mapped_string);
            iVar5 = ON_ConvertWideCharToUTF8
                              (0,sWideChar,iVar5,mapped_string,mapped_string_capacity,(uint *)0x0,0,
                               0,(wchar_t **)0x0);
            if ((mapped_string_capacity == 0) ||
               (iVar4 = ON_wString::Length(&wide_mapped_string), iVar4 <= mapped_string_capacity)) {
              if (iVar5 < mapped_string_capacity && pcVar8[-1] == '\0') {
                mapped_string[iVar5] = '\0';
                iVar5 = iVar5 + 1;
              }
            }
            else {
              iVar5 = 0;
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
                         ,0xa8b,"","mapped_string_capacity too small.");
            }
            ON_wString::~ON_wString(&wide_mapped_string);
            ON_wString::~ON_wString(&wide_string);
            return iVar5;
          }
        }
        if (mapped_string_capacity == 0 || pcVar6 < pcVar8) {
          return iVar5;
        }
      }
      if (map_type == LowerCase) {
        OStackY_70 = LowerOrdinal;
      }
      else {
        if (map_type != UpperCase) {
          pcVar6 = "invalid map_type.";
          iVar5 = 0xaac;
          goto LAB_005c514d;
        }
        OStackY_70 = UpperOrdinal;
      }
      iVar5 = MapStringOrdinal(OStackY_70,string,iVar5,mapped_string,mapped_string_capacity);
      return iVar5;
    }
    pcVar6 = "string is nullptr.";
    iVar5 = 0xa6a;
  }
LAB_005c514d:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_compare.cpp"
             ,iVar5,"",pcVar6);
  return 0;
}

Assistant:

int ON_String::MapString(
  const class ON_Locale& locale,
  ON_StringMapType map_type,
  const char* string,
  int element_count,
  char* mapped_string,
  int mapped_string_capacity
  )
{
  if (mapped_string_capacity < 0)
  {
    ON_ERROR("mapped_string_capacity is < 0.");
    return 0;
  }

  if (0 == mapped_string_capacity)
    mapped_string = nullptr;
  else if (mapped_string_capacity > 0)
  {
    if (nullptr == mapped_string)
    {
      ON_ERROR("mapped_string is nullptr.");
      return 0;
    }
    if ( string != mapped_string )
      mapped_string[0] = 0;
  }

  if (element_count < 0)
  {
    element_count = ON_String::Length(string);
    if (element_count < 0 )
      return 0; // string has more than max int elements - probably missing a null terminator.
  }

  if ( 0 == element_count)
  {
    return 1;
  }

  if (nullptr == string)
  {
    ON_ERROR("string is nullptr.");
    return 0;
  }

  if (false == locale.IsOrdinal())
  {
    const char* s = string;
    const char* s1 = s + element_count;
    while (s < s1)
    {
      char c = *s++;
      if (c >= 0 && c <= 127)
        continue;

      // UTF-8 multi char element code point
      // No robust UTF-8 tools are available from the Windows or Mac API.
      // TODO - investigate using ICU to avoid UTF-8 -> wide char -> UTF-8 conversion
      const ON_wString wide_string(string, element_count);
      const ON_wString wide_mapped_string = wide_string.MapString(locale, map_type);
      int mapped_element_count = ON_ConvertWideCharToUTF8(
        false, // bTestByteOrder
        static_cast<const wchar_t*>(wide_mapped_string),
        wide_mapped_string.Length(),
        mapped_string,
        mapped_string_capacity,
        nullptr,
        0,
        0,
        nullptr
        );

      if (mapped_string_capacity > 0 && wide_mapped_string.Length() > mapped_string_capacity)
      {
        ON_ERROR("mapped_string_capacity too small.");
        return 0;
      }

      if (0 == string[element_count - 1] && mapped_element_count < mapped_string_capacity)
      {
        if (mapped_element_count < mapped_string_capacity)
        {
          mapped_string[mapped_element_count] = 0;
          mapped_element_count++; // count the null terminator
        }
        else
        {
          ON_ERROR("mapped_string_capacity too small.");
          return 0;
        }
      }
      return mapped_element_count;
    }
  }

  if ( 0 == mapped_string_capacity )
    return element_count;

  switch (map_type)
  {
  case ON_StringMapType::UpperCase:
    return ON_String::MapStringOrdinal(ON_StringMapOrdinalType::UpperOrdinal,string,element_count,mapped_string,mapped_string_capacity);
    break;
  case ON_StringMapType::LowerCase:
    return ON_String::MapStringOrdinal(ON_StringMapOrdinalType::LowerOrdinal,string,element_count,mapped_string,mapped_string_capacity);
    break;
  default:
    ON_ERROR("invalid map_type.");
    break;
  }

  return 0;
}